

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

InplaceStr GetModuleName(Allocator *allocator,char *moduleRoot,IntrusiveList<SynIdentifier> parts)

{
  char *__src;
  uint uVar1;
  size_t sVar2;
  SynIdentifier *pSVar3;
  undefined4 extraout_var;
  SynIdentifier *pSVar4;
  int iVar5;
  char *__dest;
  InplaceStr IVar6;
  IntrusiveList<SynIdentifier> local_28;
  
  local_28.tail = parts.tail;
  local_28.head = parts.head;
  uVar1 = IntrusiveList<SynIdentifier>::size(&local_28);
  if (moduleRoot == (char *)0x0) {
    iVar5 = uVar1 + 2;
    pSVar3 = local_28.head;
  }
  else {
    sVar2 = strlen(moduleRoot);
    iVar5 = uVar1 + (int)sVar2 + 3;
    pSVar3 = local_28.head;
  }
  while (pSVar3 != (SynIdentifier *)0x0) {
    iVar5 = iVar5 + (*(int *)&(pSVar3->name).end - *(int *)&(pSVar3->name).begin);
    pSVar3 = (SynIdentifier *)(pSVar3->super_SynBase).next;
    if ((pSVar3 == (SynIdentifier *)0x0) || ((pSVar3->super_SynBase).typeID != 4)) {
      pSVar3 = (SynIdentifier *)0x0;
    }
  }
  iVar5 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)(iVar5 + 1));
  IVar6.begin = (char *)CONCAT44(extraout_var,iVar5);
  pSVar3 = local_28.head;
  __dest = IVar6.begin;
  if (moduleRoot != (char *)0x0) {
    strcpy(IVar6.begin,moduleRoot);
    sVar2 = strlen(moduleRoot);
    __dest = IVar6.begin + sVar2 + 1;
    IVar6.begin[sVar2] = '/';
    pSVar3 = local_28.head;
  }
  while (pSVar4 = pSVar3, pSVar4 != (SynIdentifier *)0x0) {
    __src = (pSVar4->name).begin;
    memcpy(__dest,__src,(ulong)(uint)(*(int *)&(pSVar4->name).end - (int)__src));
    __dest = __dest + (uint)(*(int *)&(pSVar4->name).end - *(int *)&(pSVar4->name).begin);
    pSVar3 = (SynIdentifier *)0x0;
    if ((pSVar4->super_SynBase).next != (SynBase *)0x0) {
      *__dest = '/';
      __dest = __dest + 1;
      pSVar4 = (SynIdentifier *)(pSVar4->super_SynBase).next;
      pSVar3 = (SynIdentifier *)0x0;
      if ((pSVar4 != (SynIdentifier *)0x0) && (pSVar3 = pSVar4, (pSVar4->super_SynBase).typeID != 4)
         ) {
        pSVar3 = (SynIdentifier *)0x0;
      }
    }
  }
  builtin_strncpy(__dest,".nc",4);
  sVar2 = strlen(IVar6.begin);
  IVar6.end = IVar6.begin + sVar2;
  return IVar6;
}

Assistant:

InplaceStr GetModuleName(Allocator *allocator, const char *moduleRoot, IntrusiveList<SynIdentifier> parts)
{
	unsigned pathLength = unsigned(parts.size() - 1 + strlen(".nc"));

	if(moduleRoot)
		pathLength += unsigned(strlen(moduleRoot)) + 1;

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
		pathLength += part->name.length();

	char *path = (char*)allocator->alloc(pathLength + 1);

	char *pos = path;

	if(moduleRoot)
	{
		strcpy(pos, moduleRoot);
		pos += strlen(moduleRoot);

		*pos++ = '/';
	}

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
	{
		memcpy(pos, part->name.begin, part->name.length());
		pos += part->name.length();

		if(part->next)
			*pos++ = '/';
	}

	strcpy(pos, ".nc");
	pos += strlen(".nc");

	*pos = 0;

	return InplaceStr(path);
}